

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

container_t * container_add(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint8_t uVar4;
  uint64_t *puVar5;
  int iVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  ulong uVar8;
  uint unaff_R13D;
  uint uVar9;
  uint8_t local_29;
  
  local_29 = typecode;
  if ((int)CONCAT71(in_register_00000011,typecode) == 4) {
    c = shared_container_extract_copy((shared_container_t *)c,&local_29);
  }
  if (local_29 == '\x03') {
    run_container_add((run_container_t *)c,val);
    uVar4 = '\x03';
    goto LAB_00105603;
  }
  if (local_29 == '\x02') {
    iVar2 = ((array_container_t *)c)->cardinality;
    if (((long)iVar2 == 0) ||
       ((iVar2 < 0x1000 && (((array_container_t *)c)->array[(long)iVar2 + -1] < val)))) {
      if (iVar2 == ((array_container_t *)c)->capacity) {
        array_container_grow((array_container_t *)c,((array_container_t *)c)->capacity + 1,true);
      }
      iVar2 = ((array_container_t *)c)->cardinality;
      ((array_container_t *)c)->cardinality = iVar2 + 1;
      ((array_container_t *)c)->array[iVar2] = val;
LAB_001055ad:
      iVar6 = 1;
    }
    else {
      iVar6 = iVar2 + -1;
      uVar7 = 0;
      do {
        if (iVar6 < (int)uVar7) {
          uVar9 = ~uVar7;
          break;
        }
        uVar9 = uVar7 + iVar6 >> 1;
        uVar1 = *(ushort *)
                 ((long)((array_container_t *)c)->array + (ulong)(uVar7 + iVar6 & 0xfffffffe));
        if (uVar1 < val) {
          uVar7 = uVar9 + 1;
          bVar3 = true;
          uVar9 = unaff_R13D;
        }
        else if (val < uVar1) {
          iVar6 = uVar9 - 1;
          bVar3 = true;
          uVar9 = unaff_R13D;
        }
        else {
          bVar3 = false;
        }
        unaff_R13D = uVar9;
      } while (bVar3);
      iVar6 = (int)uVar9 >> 0x1f;
      if ((iVar2 < 0x1000) && ((int)uVar9 < 0)) {
        if (iVar2 == ((array_container_t *)c)->capacity) {
          array_container_grow((array_container_t *)c,((array_container_t *)c)->capacity + 1,true);
        }
        uVar9 = ~uVar9;
        memmove(((array_container_t *)c)->array + (ulong)uVar9 + 1,
                ((array_container_t *)c)->array + uVar9,(long)(int)(iVar2 - uVar9) * 2);
        ((array_container_t *)c)->array[uVar9] = val;
        ((array_container_t *)c)->cardinality = ((array_container_t *)c)->cardinality + 1;
        goto LAB_001055ad;
      }
    }
    uVar4 = '\x02';
    if (iVar6 != -1) goto LAB_00105603;
    c = bitset_container_from_array((array_container_t *)c);
    puVar5 = (uint64_t *)((array_container_t *)c)->array;
  }
  else {
    puVar5 = (uint64_t *)((array_container_t *)c)->array;
  }
  uVar8 = puVar5[val >> 6] | 1L << ((ulong)val & 0x3f);
  ((array_container_t *)c)->cardinality =
       ((array_container_t *)c)->cardinality +
       (int)((puVar5[val >> 6] ^ uVar8) >> ((byte)val & 0x3f));
  puVar5[val >> 6] = uVar8;
  uVar4 = '\x01';
LAB_00105603:
  *new_typecode = uVar4;
  return (array_container_t *)c;
}

Assistant:

static inline container_t *container_add(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_set(CAST_bitset(c), val);
            *new_typecode = BITSET_CONTAINER_TYPE;
            return c;
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *ac = CAST_array(c);
            if (array_container_try_add(ac, val, DEFAULT_MAX_SIZE) != -1) {
                *new_typecode = ARRAY_CONTAINER_TYPE;
                return ac;
            } else {
                bitset_container_t *bitset = bitset_container_from_array(ac);
                bitset_container_add(bitset, val);
                *new_typecode = BITSET_CONTAINER_TYPE;
                return bitset;
            }
        } break;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_add(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}